

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O2

void set_target_fps_aux(void)

{
  ulong in_RAX;
  Display *pDVar1;
  GLXDrawable GVar2;
  int iVar3;
  uint currentInterval;
  uint maxInterval;
  undefined8 local_28;
  
  if (SwapIntervalEXT != (PFNGLXSWAPINTERVALEXTPROC)0x0) {
    iVar3 = (int)(g_time_for_frame * 60.0 + 0.5);
    local_28 = in_RAX;
    pDVar1 = (Display *)glXGetCurrentDisplay();
    GVar2 = glXGetCurrentDrawable();
    (*SwapIntervalEXT)(pDVar1,GVar2,iVar3);
    glXQueryDrawable(pDVar1,GVar2,0x20f1,&local_28);
    if ((int)local_28 != iVar3) {
      glXQueryDrawable(pDVar1,GVar2,0x20f2,(long)&local_28 + 4);
      fprintf(_stderr,"Cannot set target swap interval. Current swap interval is %d (max: %d)\n",
              local_28 & 0xffffffff,local_28 >> 0x20);
    }
    g_use_hardware_sync = true;
  }
  return;
}

Assistant:

void
set_target_fps_aux() {
    // Assuming the monitor refresh rate is 60 hz
    int interval = (int) ((60.0 * g_time_for_frame) + 0.5);

#if defined(_WIN32) || defined(WIN32)

    if (SwapIntervalEXT != 0x0) {
        bool success = SwapIntervalEXT(interval);
        if (GetSwapIntervalEXT != 0x0) {
            int currentInterval = GetSwapIntervalEXT();
            if (interval != currentInterval) {
                fprintf(stderr, "Cannot set target swap interval. Current swap interval is %d\n", currentInterval);
            }
        }
        else if (success == false) {
            fprintf(stderr, "Cannot set target swap interval.\n");
        }
        g_use_hardware_sync = true;
    }

#elif defined(linux)
    #define kGLX_SWAP_INTERVAL_EXT               0x20F1
    #define kGLX_MAX_SWAP_INTERVAL_EXT           0x20F2

    if (SwapIntervalEXT != 0x0) {
        Display         *dpy     = glXGetCurrentDisplay();
        GLXDrawable     drawable = glXGetCurrentDrawable();
        unsigned int    currentInterval, maxInterval;

        SwapIntervalEXT(dpy, drawable, interval);
        glXQueryDrawable(dpy, drawable, kGLX_SWAP_INTERVAL_EXT, &currentInterval);
        if (interval != (int)currentInterval) {
            glXQueryDrawable(dpy, drawable, kGLX_MAX_SWAP_INTERVAL_EXT, &maxInterval);
            fprintf(stderr, "Cannot set target swap interval. Current swap interval is %d (max: %d)\n", currentInterval, maxInterval);
        }
        g_use_hardware_sync = true;
    }

#endif
}